

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-test.cc
# Opt level: O0

void __thiscall
ExprTest_RelationalExpr_Test::~ExprTest_RelationalExpr_Test(ExprTest_RelationalExpr_Test *this)

{
  void *in_RDI;
  
  ~ExprTest_RelationalExpr_Test((ExprTest_RelationalExpr_Test *)0x14a8e8);
  operator_delete(in_RDI,0x58);
  return;
}

Assistant:

TEST_F(ExprTest, RelationalExpr) {
  mp::RelationalExpr e;
  EXPECT_TRUE(e == 0);
  (void)LogicalExpr(e);
  auto lhs = factory_.MakeNumericConstant(42);
  auto rhs = factory_.MakeVariable(0);
  e = factory_.MakeRelational(expr::EQ, lhs, rhs);
  EXPECT_TRUE(e != 0);
  EXPECT_EQ(expr::EQ, e.kind());
  EXPECT_EQ(lhs, e.lhs());
  EXPECT_EQ(rhs, e.rhs());
  EXPECT_ASSERT(factory_.MakeRelational(expr::ATLEAST, lhs, rhs),
                "invalid expression kind");
  EXPECT_ASSERT(factory_.MakeRelational(expr::EQ, NumericExpr(), rhs),
                "invalid argument");
  EXPECT_ASSERT(factory_.MakeRelational(expr::EQ, lhs, NumericExpr()),
                "invalid argument");
}